

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocument_p.cpp
# Opt level: O3

int __thiscall
QTextDocumentPrivate::remove_string(QTextDocumentPrivate *this,int pos,uint length,Operation op)

{
  BlockMap *this_00;
  uint *puVar1;
  quint32 *pqVar2;
  QTextBlockData *pQVar3;
  QTextLayout *pQVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint p;
  uint uVar8;
  uint z;
  long lVar9;
  
  this_00 = &this->blocks;
  uVar8 = QFragmentMapData<QTextBlockData>::findNode(&this_00->data,pos,0);
  z = QFragmentMapData<QTextFragmentData>::findNode(&(this->fragments).data,pos,0);
  pQVar3 = (this->blocks).data.field_0.fragments;
  pqVar2 = pQVar3[uVar8].super_QFragment<3>.size_array;
  *pqVar2 = *pqVar2 - length;
  uVar7 = pQVar3[uVar8].super_QFragment<3>.parent;
  uVar6 = uVar8;
  while (uVar5 = uVar7, uVar5 != 0) {
    puVar1 = (uint *)((long)(this_00->data).field_0.head + (ulong)uVar5 * 0x48);
    if (puVar1[1] == uVar6) {
      puVar1[4] = puVar1[4] - length;
    }
    uVar6 = uVar5;
    uVar7 = *puVar1;
  }
  if ((uVar8 != 0) &&
     (pQVar4 = (this_00->data).field_0.fragments[uVar8].layout, pQVar4 != (QTextLayout *)0x0)) {
    QTextEngine::invalidate(pQVar4->d);
  }
  objectForFormat(this,(this->fragments).data.field_0.fragments[z].format);
  lVar9 = QMetaObject::cast((QObject *)&QTextFrame::staticMetaObject);
  if (lVar9 != 0) {
    (**(code **)(**(long **)(lVar9 + 8) + 0x28))
              (*(long **)(lVar9 + 8),
               (this->text).d.ptr[(this->fragments).data.field_0.fragments[z].stringPosition],z);
    this->framesDirty = true;
  }
  uVar8 = QFragmentMapData<QTextFragmentData>::erase_single(&(this->fragments).data,z);
  if (this->undoEnabled == false) {
    this->unreachableCharacterCount = this->unreachableCharacterCount + length;
  }
  adjustDocumentChangesAndCursors(this,pos,-length,op);
  return uVar8;
}

Assistant:

int QTextDocumentPrivate::remove_string(int pos, uint length, QTextUndoCommand::Operation op)
{
    Q_ASSERT(pos >= 0);
    Q_ASSERT(blocks.length() == fragments.length());
    Q_ASSERT(q20::cmp_greater_equal(blocks.length(), pos+length));

    int b = blocks.findNode(pos);
    uint x = fragments.findNode(pos);

    Q_ASSERT(blocks.size(b) > length);
    Q_ASSERT(x && q20::cmp_equal(fragments.position(x), pos) && fragments.size(x) == length);
    Q_ASSERT(noBlockInString(QStringView{text}.mid(fragments.fragment(x)->stringPosition, length)));

    blocks.setSize(b, blocks.size(b)-length);

    QTextFrame *frame = qobject_cast<QTextFrame *>(objectForFormat(fragments.fragment(x)->format));
    if (frame) {
        frame->d_func()->fragmentRemoved(text.at(fragments.fragment(x)->stringPosition), x);
        framesDirty = true;
    }

    const int w = fragments.erase_single(x);

    if (!undoEnabled)
        unreachableCharacterCount += length;

    adjustDocumentChangesAndCursors(pos, -int(length), op);

    return w;
}